

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::CommandQueueVkImpl::EnqueueSignalFence(CommandQueueVkImpl *this,VkFence vkFence)

{
  VkResult VVar1;
  string msg;
  string local_38;
  
  if (vkFence == (VkFence)0x0) {
    FormatString<char[25]>(&local_38,(char (*) [25])"vkFence must not be null");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"EnqueueSignalFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::mutex::lock(&this->m_QueueMutex);
  VVar1 = (*vkQueueSubmit)(this->m_VkQueue,0,(VkSubmitInfo *)0x0,vkFence);
  if (VVar1 != VK_SUCCESS) {
    FormatString<char[59]>
              (&local_38,(char (*) [59])"Failed to submit fence signal command to the command queue"
              );
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"EnqueueSignalFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0xfb);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_QueueMutex);
  return;
}

Assistant:

void CommandQueueVkImpl::EnqueueSignalFence(VkFence vkFence)
{
    DEV_CHECK_ERR(vkFence != VK_NULL_HANDLE, "vkFence must not be null");

    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    auto err = vkQueueSubmit(m_VkQueue, 0, nullptr, vkFence);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to submit fence signal command to the command queue");
    (void)err;
}